

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symtab.c
# Opt level: O1

void GetMacLine(void)

{
  char cVar1;
  InFCtl *pIVar2;
  NameChunk *pNVar3;
  NameChunk **ppNVar4;
  char *pcVar5;
  
  pIVar2 = InF;
  pNVar3 = (NameChunk *)InF->UPtr;
  if (*(char *)&pNVar3->Link == '\n') {
    ppNVar4 = &NameStart;
    do {
      ppNVar4 = &((NameChunk *)ppNVar4)->Link->Link;
    } while ((NameChunk *)(((NameChunk *)ppNVar4)->Data + 0x3ff) < pNVar3 || pNVar3 < ppNVar4);
    pNVar3 = (NameChunk *)((NameChunk *)ppNVar4)->Link->Data;
    InF->UPtr = (char *)pNVar3;
  }
  pcVar5 = Line;
  do {
    cVar1 = *(char *)&pNVar3->Link;
    pNVar3 = (NameChunk *)((long)&pNVar3->Link + 1);
    *pcVar5 = cVar1;
    pcVar5 = pcVar5 + 1;
  } while (cVar1 != '\0');
  pIVar2->UPtr = (char *)pNVar3;
  return;
}

Assistant:

void GetMacLine(void)
/* Gets the next stored user macro line. */
{
	register char *s, *t;
	register struct NameChunk *np;

	s = InF->UPtr;
	if (*s == '\n') { /* Continue in next chunk. */
		np = NameStart;
		while ((s < (char *) np) || (s > ((char *) np + CHUNKSIZE)))
			np = np->Link; /* Find the chunk we're in. */
		InF->UPtr = (char *) (np->Link) + sizeof(struct NameChunk *);
		s = InF->UPtr;
	}
	t = Line;
	while ((*t++ = *s++))
		/* Copy InF->UPtr to Line, then bump InF->UPtr. */
		; /*  (It's faster than doing a strcpy followed   */
	InF->UPtr = s; /*  by a strlen to bump the pointer.)           */
}